

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O3

Node * __thiscall
TMap<PClassWeapon_*,_int,_THashTraits<PClassWeapon_*>,_TValueTraits<int>_>::NewKey
          (TMap<PClassWeapon_*,_int,_THashTraits<PClassWeapon_*>,_TValueTraits<int>_> *this,
          PClassWeapon *key)

{
  Node *pNVar1;
  PClassWeapon *pPVar2;
  undefined4 uVar3;
  Node *pNVar4;
  Node *pNVar5;
  Node *pNVar6;
  Node *pNVar7;
  hash_t hVar8;
  uint uVar9;
  uint uVar10;
  
  pNVar5 = this->Nodes;
  hVar8 = this->Size;
  do {
    uVar10 = hVar8 - 1 & (uint)key;
    pNVar1 = pNVar5 + uVar10;
    pNVar4 = pNVar1->Next;
    if (pNVar4 == (Node *)0x1) {
LAB_004af823:
      pNVar7 = (Node *)0x0;
      pNVar5 = pNVar1;
LAB_004af828:
      pNVar1->Next = pNVar7;
      this->NumUsed = this->NumUsed + 1;
      (pNVar5->Pair).Key = key;
      return pNVar5;
    }
    pNVar7 = this->LastFree;
    while (pNVar6 = pNVar7, pNVar7 = pNVar6 + -1, pNVar5 < pNVar6) {
      if (pNVar7->Next == (Node *)0x1) {
        this->LastFree = pNVar7;
        uVar9 = hVar8 - 1 & *(uint *)&(pNVar1->Pair).Key;
        if (uVar9 != uVar10) {
          pNVar5 = pNVar5 + uVar9;
          do {
            pNVar4 = pNVar5;
            pNVar5 = pNVar4->Next;
          } while (pNVar5 != pNVar1);
          pNVar4->Next = pNVar7;
          uVar3 = *(undefined4 *)&(pNVar1->Pair).field_0xc;
          pNVar6[-1].Pair.Value = (pNVar1->Pair).Value;
          *(undefined4 *)&pNVar6[-1].Pair.field_0xc = uVar3;
          pPVar2 = (pNVar1->Pair).Key;
          pNVar7->Next = pNVar1->Next;
          pNVar6[-1].Pair.Key = pPVar2;
          goto LAB_004af823;
        }
        pNVar7->Next = pNVar4;
        pNVar5 = pNVar7;
        goto LAB_004af828;
      }
    }
    this->LastFree = pNVar7;
    Resize(this,hVar8 * 2);
    pNVar5 = this->Nodes;
    hVar8 = this->Size;
  } while( true );
}

Assistant:

Node *NewKey(const KT key)
	{
		Node *mp = MainPosition(key);
		if (!mp->IsNil())
		{
			Node *othern;
			Node *n = GetFreePos();		/* get a free place */
			if (n == NULL)				/* cannot find a free place? */
			{
				Rehash();				/* grow table */
				return NewKey(key);		/* re-insert key into grown table */
			}
			othern = MainPosition(mp->Pair.Key);
			if (othern != mp)			/* is colliding node out of its main position? */
			{	/* yes; move colliding node into free position */
				while (othern->Next != mp)	/* find previous */
				{
					othern = othern->Next;
				}
				othern->Next = n;		/* redo the chain with 'n' in place of 'mp' */
				CopyNode(n, mp); /* copy colliding node into free pos. (mp->Next also goes) */
				mp->Next = NULL;		/* now 'mp' is free */
			}
			else						/* colliding node is in its own main position */
			{							/* new node will go into free position */
				n->Next = mp->Next;		/* chain new position */
				mp->Next = n;
				mp = n;
			}
		}
		else
		{
			mp->Next = NULL;
		}
		++NumUsed;
		::new(&mp->Pair.Key) KT(key);
		return mp;
	}